

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O1

void Gia_LutDelayTraceSortPins(Gia_Man_t *p,int iObj,int *pPinPerm,float *pPinDelays)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  if ((-1 < iObj) && (pVVar3 = p->vMapping, iObj < pVVar3->nSize)) {
    piVar4 = pVVar3->pArray;
    if (piVar4[(uint)iObj] == 0) {
      __assert_fail("Gia_ObjIsLut(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                    ,0x31,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
    }
    iVar6 = pVVar3->nSize;
    if (iObj < iVar6) {
      lVar11 = 0;
      do {
        lVar12 = (long)piVar4[(uint)iObj];
        if ((lVar12 < 0) || (iVar6 <= piVar4[(uint)iObj])) break;
        if (piVar4[lVar12] <= lVar11) {
          iVar6 = pVVar3->nSize;
          if (iObj < iVar6) {
            uVar9 = 1;
            uVar5 = 0;
            goto LAB_002291cd;
          }
          break;
        }
        iVar6 = piVar4[lVar12 + lVar11 + 1];
        pPinPerm[lVar11] = (int)lVar11;
        if (iVar6 < 0) {
LAB_002292be:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        uVar7 = iVar6 * 3;
        uVar1 = p->vTiming->nSize;
        if (uVar1 == uVar7 || SBORROW4(uVar1,uVar7) != (int)(uVar1 + iVar6 * -3) < 0)
        goto LAB_002292be;
        pPinDelays[lVar11] = p->vTiming->pArray[uVar7];
        lVar11 = lVar11 + 1;
        iVar6 = pVVar3->nSize;
      } while (iObj < iVar6);
    }
  }
  goto LAB_0022925c;
  while( true ) {
    uVar1 = piVar4[iVar2];
    uVar10 = (ulong)uVar1;
    if ((long)(int)uVar1 + -1 <= (long)uVar5) {
      if ((uVar10 != 0) && ((int)uVar1 <= *pPinPerm)) {
        __assert_fail("Gia_ObjLutSize(p, iObj) == 0 || pPinPerm[0] < Gia_ObjLutSize(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                      ,0x47,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
      }
      if (1 < (int)uVar1) {
        uVar5 = 1;
        do {
          if ((int)uVar1 <= pPinPerm[uVar5]) {
            __assert_fail("pPinPerm[i] < Gia_ObjLutSize(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                          ,0x4a,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
          }
          if (pPinDelays[pPinPerm[uVar5 - 1]] < pPinDelays[pPinPerm[uVar5]]) {
            __assert_fail("pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                          ,0x4b,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
          }
          uVar5 = uVar5 + 1;
        } while (uVar10 != uVar5);
      }
      return;
    }
    uVar7 = (uint)uVar5;
    if ((long)(uVar5 + 1) < (long)(int)uVar1) {
      uVar13 = uVar9;
      uVar14 = uVar5 & 0xffffffff;
      do {
        uVar8 = uVar13 & 0xffffffff;
        if (pPinDelays[pPinPerm[uVar13]] < pPinDelays[pPinPerm[(int)uVar14]] ||
            pPinDelays[pPinPerm[uVar13]] == pPinDelays[pPinPerm[(int)uVar14]]) {
          uVar8 = uVar14;
        }
        uVar13 = uVar13 + 1;
        uVar7 = (uint)uVar8;
        uVar14 = uVar8;
      } while (uVar10 != uVar13);
    }
    if (uVar5 != uVar7) {
      iVar6 = pPinPerm[uVar5];
      pPinPerm[uVar5] = pPinPerm[(int)uVar7];
      pPinPerm[(int)uVar7] = iVar6;
    }
    iVar6 = pVVar3->nSize;
    uVar9 = uVar9 + 1;
    uVar5 = uVar5 + 1;
    if (iVar6 <= iObj) break;
LAB_002291cd:
    iVar2 = piVar4[(uint)iObj];
    if (((long)iVar2 < 0) || (iVar6 <= iVar2)) break;
  }
LAB_0022925c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sorts the pins in the decreasing order of delays.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_LutDelayTraceSortPins( Gia_Man_t * p, int iObj, int * pPinPerm, float * pPinDelays )
{
    int iFanin, i, j, best_i, temp;
    assert( Gia_ObjIsLut(p, iObj) );
    // start the trivial permutation and collect pin delays
    Gia_LutForEachFanin( p, iObj, iFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Gia_ObjTimeArrival(p, iFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Gia_ObjLutSize(p, iObj)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Gia_ObjLutSize(p, iObj); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Gia_ObjLutSize(p, iObj) == 0 || pPinPerm[0] < Gia_ObjLutSize(p, iObj) );
    for ( i = 1; i < Gia_ObjLutSize(p, iObj); i++ )
    {
        assert( pPinPerm[i] < Gia_ObjLutSize(p, iObj) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}